

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

uint * Kit_DsdTruthComputeNode_rec(Kit_DsdMan_t *p,Kit_DsdNtk_t *pNtk,int Id)

{
  ushort uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  Kit_DsdObj_t *pKVar7;
  Kit_DsdObj_t KVar8;
  uint *puVar9;
  uint *puVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ushort uVar14;
  ushort uVar15;
  ulong uVar16;
  uint *local_b8 [17];
  
  if (-1 < Id) {
    uVar1 = pNtk->nVars;
    if ((uint)Id < (uint)pNtk->nNodes + (uint)uVar1) {
      if ((uint)Id < (uint)uVar1) {
        if (p->vTtNodes->nSize <= Id) {
LAB_005d2549:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        puVar10 = (uint *)p->vTtNodes->pArray[(uint)Id];
      }
      else {
        if (p->vTtNodes->nSize <= Id) goto LAB_005d2549;
        pKVar7 = pNtk->pNodes[(long)Id - (ulong)uVar1];
        if (pKVar7 == (Kit_DsdObj_t *)0x0) {
          __assert_fail("Id < pNtk->nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                        ,0x23f,
                        "unsigned int *Kit_DsdTruthComputeNode_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int)"
                       );
        }
        puVar10 = (uint *)p->vTtNodes->pArray[(uint)Id];
        KVar8 = *pKVar7;
        uVar11 = (uint)KVar8 >> 6;
        if ((uVar11 & 7) == 1) {
          if (0x3ffffff < (uint)KVar8) {
            __assert_fail("pObj->nFans == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                          ,0x246,
                          "unsigned int *Kit_DsdTruthComputeNode_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int)"
                         );
          }
          uVar11 = 1 << ((char)uVar1 - 5U & 0x1f);
          if (uVar1 < 6) {
            uVar11 = 1;
          }
          if (0 < (int)uVar11) {
            puVar10 = (uint *)memset(puVar10,0xff,(ulong)uVar11 << 2);
            return puVar10;
          }
        }
        else if ((uVar11 & 7) == 2) {
          if (((uint)KVar8 & 0xfc000000) != 0x4000000) {
            __assert_fail("pObj->nFans == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                          ,0x24e,
                          "unsigned int *Kit_DsdTruthComputeNode_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int)"
                         );
          }
          uVar1 = *(ushort *)(pKVar7 + 1);
          puVar9 = Kit_DsdTruthComputeNode_rec(p,pNtk,(uint)(uVar1 >> 1));
          uVar2 = pNtk->nVars;
          uVar13 = (ulong)(uint)(1 << ((char)uVar2 - 5U & 0x1f));
          if ((ushort)uVar2 < 6) {
            uVar13 = 1;
          }
          if ((uVar1 & 1) == 0) {
            if (0 < (int)uVar13) {
              uVar13 = uVar13 + 1;
              do {
                puVar10[uVar13 - 2] = puVar9[uVar13 - 2];
                uVar13 = uVar13 - 1;
              } while (1 < uVar13);
            }
          }
          else if (0 < (int)uVar13) {
            uVar13 = uVar13 + 1;
            do {
              puVar10[uVar13 - 2] = ~puVar9[uVar13 - 2];
              uVar13 = uVar13 - 1;
            } while (1 < uVar13);
          }
        }
        else {
          if (0x3ffffff < (uint)KVar8) {
            uVar13 = 0;
            do {
              puVar9 = Kit_DsdTruthComputeNode_rec
                                 (p,pNtk,(uint)(*(ushort *)((long)&pKVar7[1].field_0x0 + uVar13 * 2)
                                               >> 1));
              local_b8[uVar13] = puVar9;
              uVar13 = uVar13 + 1;
              KVar8 = *pKVar7;
            } while (uVar13 < (uint)KVar8 >> 0x1a);
            uVar11 = (uint)KVar8 >> 6;
          }
          uVar11 = uVar11 & 7;
          if (uVar11 == 3) {
            uVar4 = pNtk->nVars;
            uVar11 = 1 << ((char)uVar4 - 5U & 0x1f);
            if ((ushort)uVar4 < 6) {
              uVar11 = 1;
            }
            if (0 < (int)uVar11) {
              memset(puVar10,0xff,(ulong)uVar11 * 4);
              KVar8 = *pKVar7;
            }
            if (0x3ffffff < (uint)KVar8) {
              uVar12 = (ulong)uVar11 + 1;
              uVar13 = 0;
              do {
                puVar9 = local_b8[uVar13];
                if ((*(byte *)((long)&pKVar7[1].field_0x0 + uVar13 * 2) & 1) == 0) {
                  uVar16 = uVar12;
                  if (0 < (int)uVar11) {
                    do {
                      puVar10[uVar16 - 2] = puVar10[uVar16 - 2] & puVar9[uVar16 - 2];
                      uVar16 = uVar16 - 1;
                    } while (1 < uVar16);
                  }
                }
                else {
                  uVar16 = uVar12;
                  if (0 < (int)uVar11) {
                    do {
                      puVar10[uVar16 - 2] = puVar10[uVar16 - 2] & ~puVar9[uVar16 - 2];
                      uVar16 = uVar16 - 1;
                    } while (1 < uVar16);
                  }
                }
                uVar13 = uVar13 + 1;
              } while (uVar13 < (uint)*pKVar7 >> 0x1a);
            }
          }
          else if (uVar11 == 4) {
            uVar3 = pNtk->nVars;
            uVar11 = 1 << ((char)uVar3 - 5U & 0x1f);
            if ((ushort)uVar3 < 6) {
              uVar11 = 1;
            }
            uVar13 = (ulong)uVar11;
            if (0 < (int)uVar11) {
              memset(puVar10,0,uVar13 * 4);
              KVar8 = *pKVar7;
            }
            if (0x3ffffff < (uint)KVar8) {
              uVar12 = 0;
              uVar1 = 0;
              do {
                uVar15 = uVar1;
                uVar14 = *(ushort *)((long)&pKVar7[1].field_0x0 + uVar12 * 2);
                if (0 < (int)uVar11) {
                  puVar9 = local_b8[uVar12];
                  uVar16 = uVar13 + 1;
                  do {
                    puVar10[uVar16 - 2] = puVar10[uVar16 - 2] ^ puVar9[uVar16 - 2];
                    uVar16 = uVar16 - 1;
                  } while (1 < uVar16);
                  KVar8 = *pKVar7;
                }
                uVar14 = uVar14 & 1;
                uVar12 = uVar12 + 1;
                uVar1 = uVar15 ^ uVar14;
              } while (uVar12 < (uint)KVar8 >> 0x1a);
              if ((0 < (int)uVar11) && (uVar15 != uVar14)) {
                uVar13 = uVar13 + 1;
                do {
                  puVar10[uVar13 - 2] = ~puVar10[uVar13 - 2];
                  uVar13 = uVar13 - 1;
                } while (1 < uVar13);
              }
            }
          }
          else {
            if (uVar11 != 5) {
              __assert_fail("pObj->Type == KIT_DSD_PRIME",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                            ,0x272,
                            "unsigned int *Kit_DsdTruthComputeNode_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int)"
                           );
            }
            if ((uint)KVar8 < 0x4000000) {
              uVar11 = (uint)KVar8 >> 0x1a;
            }
            else {
              uVar13 = 0;
              do {
                if ((*(byte *)((long)&pKVar7[1].field_0x0 + uVar13 * 2) & 1) != 0) {
                  uVar5 = pNtk->nVars;
                  uVar11 = 1 << ((char)uVar5 - 5U & 0x1f);
                  if ((ushort)uVar5 < 6) {
                    uVar11 = 1;
                  }
                  if (0 < (int)uVar11) {
                    puVar9 = local_b8[uVar13];
                    uVar12 = (ulong)uVar11 + 1;
                    do {
                      puVar9[uVar12 - 2] = ~puVar9[uVar12 - 2];
                      uVar12 = uVar12 - 1;
                    } while (1 < uVar12);
                    KVar8 = *pKVar7;
                  }
                }
                uVar13 = uVar13 + 1;
                uVar11 = (uint)KVar8 >> 0x1a;
              } while (uVar13 < uVar11);
            }
            puVar9 = (uint *)0x0;
            if (((uint)KVar8 & 0x1c0) == 0x140) {
              puVar9 = (uint *)((long)&pKVar7[1].field_0x0 + (ulong)((uint)KVar8 >> 8 & 0x3fc));
            }
            puVar9 = Kit_TruthCompose(p->dd,puVar9,uVar11,local_b8,(uint)pNtk->nVars,p->vTtBdds,
                                      p->vNodes);
            uVar6 = pNtk->nVars;
            uVar11 = 1 << ((char)uVar6 - 5U & 0x1f);
            if ((ushort)uVar6 < 6) {
              uVar11 = 1;
            }
            if (0 < (int)uVar11) {
              uVar13 = (ulong)uVar11 + 1;
              do {
                puVar10[uVar13 - 2] = puVar9[uVar13 - 2];
                uVar13 = uVar13 - 1;
              } while (1 < uVar13);
            }
          }
        }
      }
      return puVar10;
    }
  }
  __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
}

Assistant:

unsigned * Kit_DsdTruthComputeNode_rec( Kit_DsdMan_t * p, Kit_DsdNtk_t * pNtk, int Id )
{
    Kit_DsdObj_t * pObj;
    unsigned * pTruthRes, * pTruthFans[16], * pTruthTemp;
    unsigned i, iLit, fCompl;
//    unsigned m, nMints, * pTruthPrime, * pTruthMint; 

    // get the node with this ID
    pObj = Kit_DsdNtkObj( pNtk, Id );
    pTruthRes = (unsigned *)Vec_PtrEntry( p->vTtNodes, Id );

    // special case: literal of an internal node
    if ( pObj == NULL )
    {
        assert( Id < pNtk->nVars );
        return pTruthRes;
    }

    // constant node
    if ( pObj->Type == KIT_DSD_CONST1 )
    {
        assert( pObj->nFans == 0 );
        Kit_TruthFill( pTruthRes, pNtk->nVars );
        return pTruthRes;
    }

    // elementary variable node
    if ( pObj->Type == KIT_DSD_VAR )
    {
        assert( pObj->nFans == 1 );
        iLit = pObj->pFans[0];
        pTruthFans[0] = Kit_DsdTruthComputeNode_rec( p, pNtk, Abc_Lit2Var(iLit) );
        if ( Abc_LitIsCompl(iLit) )
            Kit_TruthNot( pTruthRes, pTruthFans[0], pNtk->nVars );
        else
            Kit_TruthCopy( pTruthRes, pTruthFans[0], pNtk->nVars );
        return pTruthRes;
    }

    // collect the truth tables of the fanins
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        pTruthFans[i] = Kit_DsdTruthComputeNode_rec( p, pNtk, Abc_Lit2Var(iLit) );
    // create the truth table

    // simple gates
    if ( pObj->Type == KIT_DSD_AND )
    {
        Kit_TruthFill( pTruthRes, pNtk->nVars );
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            Kit_TruthAndPhase( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars, 0, Abc_LitIsCompl(iLit) );
        return pTruthRes;
    }
    if ( pObj->Type == KIT_DSD_XOR )
    {
        Kit_TruthClear( pTruthRes, pNtk->nVars );
        fCompl = 0;
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        {
            Kit_TruthXor( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars );
            fCompl ^= Abc_LitIsCompl(iLit);
        }
        if ( fCompl )
            Kit_TruthNot( pTruthRes, pTruthRes, pNtk->nVars );
        return pTruthRes;
    }
    assert( pObj->Type == KIT_DSD_PRIME );
/*
    // get the truth table of the prime node
    pTruthPrime = Kit_DsdObjTruth( pObj );
    // get storage for the temporary minterm
    pTruthMint = Vec_PtrEntry(p->vTtNodes, pNtk->nVars + pNtk->nNodes);
    // go through the minterms
    nMints = (1 << pObj->nFans);
    Kit_TruthClear( pTruthRes, pNtk->nVars );
    for ( m = 0; m < nMints; m++ )
    {
        if ( !Kit_TruthHasBit(pTruthPrime, m) )
            continue;
        Kit_TruthFill( pTruthMint, pNtk->nVars );
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            Kit_TruthAndPhase( pTruthMint, pTruthMint, pTruthFans[i], pNtk->nVars, 0, ((m & (1<<i)) == 0) ^ Abc_LitIsCompl(iLit) );
        Kit_TruthOr( pTruthRes, pTruthRes, pTruthMint, pNtk->nVars );
    }
*/
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        if ( Abc_LitIsCompl(iLit) )
            Kit_TruthNot( pTruthFans[i], pTruthFans[i], pNtk->nVars );
    pTruthTemp = Kit_TruthCompose( p->dd, Kit_DsdObjTruth(pObj), pObj->nFans, pTruthFans, pNtk->nVars, p->vTtBdds, p->vNodes );
    Kit_TruthCopy( pTruthRes, pTruthTemp, pNtk->nVars );
    return pTruthRes;
}